

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int file_walk_cb(char *fpath,stat *sb,int typeflag,FTW *ftwbuf)

{
  AppCtx *ctx_00;
  _Bool _Var1;
  int iVar2;
  byte local_122d;
  byte local_122c;
  byte local_1228;
  int local_1224;
  byte local_1213;
  uint8_t seedidx;
  uint8_t num_seeds;
  undefined1 local_11d0 [8];
  PerfProfInput input;
  Filter *filter;
  Instance instance;
  char *ext;
  AppCtx *ctx;
  FTW *ftwbuf_local;
  int typeflag_local;
  stat *sb_local;
  char *fpath_local;
  
  ctx_00 = G_app_ctx_ptr;
  if ((typeflag == 0) || (typeflag == 4)) {
    instance.edge_weight = (double *)os_get_fext(fpath);
    if ((instance.edge_weight != (double *)0x0) &&
       (iVar2 = strcmp((char *)instance.edge_weight,"vrp"), iVar2 == 0)) {
      parse((Instance *)&filter,fpath);
      _Var1 = is_valid_instance((Instance *)&filter);
      if (!_Var1) {
        log_log(0x80,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/main.c"
                ,0x1b3,"%s: Failed to parse input file\n",fpath);
        exit(1);
      }
      input._4416_8_ = &ctx_00->current_batch->filter;
      _Var1 = is_filtered_instance((Filter *)input._4416_8_,(Instance *)&filter);
      if (_Var1) {
        printf("%s: Skipping since it does not match filter\n",fpath);
      }
      else {
        memset(local_11d0,0,0x1148);
        strncpy_safe(input.instance_name + 0xf8,fpath,0x1000);
        strncpy_safe(local_11d0,(char *)filter,0x100);
        hash_instance((Hash *)&stack0xffffffffffffedef,(Instance *)&filter);
        memcpy(input.filepath + 0xff9,&stack0xffffffffffffedef,0x41);
        printf("--- instance_hash :: computed_hash = %s\n",input.filepath + 0xff9);
        if (ctx_00->current_batch->nseeds < 100) {
          local_1224 = ctx_00->current_batch->nseeds;
        }
        else {
          local_1224 = 100;
        }
        if (local_1224 < 0x100) {
          if (ctx_00->current_batch->nseeds < 100) {
            local_122c = (byte)ctx_00->current_batch->nseeds;
          }
          else {
            local_122c = 100;
          }
          local_1228 = local_122c;
        }
        else {
          local_1228 = 0xff;
        }
        local_1213 = 0;
        while( true ) {
          local_122d = 0;
          if (local_1213 < local_1228) {
            local_122d = ctx_00->should_terminate ^ 0xff;
          }
          if ((local_122d & 1) == 0) break;
          input.filepath[0xff8] = local_1213;
          input.uid.hash.cstr._59_4_ = RANDOM_SEEDS[local_1213];
          handle_vrp_instance(ctx_00,(PerfProfInput *)local_11d0);
          local_1213 = local_1213 + 1;
        }
      }
      instance_destroy((Instance *)&filter);
    }
  }
  else if (typeflag == 1) {
    printf("Found dir: %s\n",fpath);
  }
  return (uint)((ctx_00->should_terminate & 1U) != 0);
}

Assistant:

int file_walk_cb(const char *fpath, const struct stat *sb, int typeflag,
                 struct FTW *ftwbuf) {
    UNUSED_PARAM(sb);
    UNUSED_PARAM(ftwbuf);

    AppCtx *ctx = G_app_ctx_ptr;

    if (typeflag == FTW_F || typeflag == FTW_SL) {
        // Is a regular file
        const char *ext = os_get_fext(fpath);
        if (ext && (0 == strcmp(ext, "vrp"))) {
            // printf("Found file: %s\n", fpath);

            Instance instance = parse(fpath);
            if (is_valid_instance(&instance)) {
                Filter *filter = &ctx->current_batch->filter;
                if (!is_filtered_instance(filter, &instance)) {

                    PerfProfInput input = {0};
                    strncpy_safe(input.filepath, fpath,
                                 ARRAY_LEN(input.filepath));

                    strncpy_safe(input.instance_name, instance.name,
                                 ARRAY_LEN(input.instance_name));

                    input.uid.hash = hash_instance(&instance);

                    printf("--- instance_hash :: computed_hash = %s\n",
                           input.uid.hash.cstr);

                    const uint8_t num_seeds = (uint8_t)(MIN(
                        UINT8_MAX, MIN(ctx->current_batch->nseeds,
                                       ARRAY_LEN_i32(RANDOM_SEEDS))));

                    for (uint8_t seedidx = 0;
                         seedidx < num_seeds && !ctx->should_terminate;
                         seedidx++) {
                        input.uid.seedidx = seedidx;

                        input.seed = RANDOM_SEEDS[seedidx];
                        handle_vrp_instance(ctx, &input);
                    }
                } else {
                    printf("%s: Skipping since it does not match filter\n",
                           fpath);
                }
                instance_destroy(&instance);
            } else {
                log_fatal("%s: Failed to parse input file\n", fpath);
                exit(EXIT_FAILURE);
            }
        }
    } else if (typeflag == FTW_D) {
        printf("Found dir: %s\n", fpath);
    }

    return ctx->should_terminate ? FTW_STOP : FTW_CONTINUE;
}